

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool medit_vnum(CHAR_DATA *ch,char *argument)

{
  return false;
}

Assistant:

bool medit_vnum(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int vnum;

	EDIT_MOB(ch, pMob);

	return false;

	if (!*argument || !is_number(argument))
	{
		send_to_char("Syntax: vnum <vnum>\n\r", ch);
		return false;
	}

	vnum = atoi(argument);

	if (vnum >= ch->in_room->area->min_vnum && vnum <= ch->in_room->area->max_vnum)
	{
		pMob->vnum = vnum;
		send_to_char("Vnum set.\n\r", ch);
		return true;
	}
	else
	{
		send_to_char("That vnum is not within the area range.\n\r", ch);
		return false;
	}

	return false;
}